

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool re2::RE2::Arg::parse_long_radix(char *str,int n,void *dest,int radix)

{
  char *__nptr;
  int *piVar1;
  long lVar2;
  int n_local;
  long *local_68;
  char *end;
  char buf [33];
  
  if (n != 0) {
    n_local = n;
    local_68 = (long *)dest;
    __nptr = TerminateNumber(buf,0x21,str,&n_local,false);
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar2 = strtol(__nptr,&end,radix);
    if (end != __nptr + n_local) {
      return false;
    }
    if (*piVar1 == 0) {
      if (local_68 == (long *)0x0) {
        return true;
      }
      *local_68 = lVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool RE2::Arg::parse_long_radix(const char* str,
                               int n,
                               void* dest,
                               int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, false);
  char* end;
  errno = 0;
  long r = strtol(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<long*>(dest)) = r;
  return true;
}